

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O0

MPP_RET vepu54x_h265_set_roi(void *dst_buf,void *src_buf,RK_S32 w,RK_S32 h)

{
  int iVar1;
  RK_S32 cu16_y;
  RK_S32 cu16_x;
  RK_S32 cu16_addr_in_frame;
  RK_S32 cu16cnt;
  RK_S32 cu16_num_line;
  RK_S32 ctu_addr;
  RK_S32 i;
  RK_S32 j;
  RK_S32 ctu_line;
  RK_S32 mb_h;
  RK_S32 mb_w;
  Vepu541RoiCfg *dst;
  Vepu541RoiCfg *src;
  RK_S32 h_local;
  RK_S32 w_local;
  void *src_buf_local;
  void *dst_buf_local;
  
  iVar1 = (int)((long)((long)(w + 0x3f) & 0xffffffffffffffc0U) / 0x40);
  for (ctu_addr = 0; ctu_addr < (int)((long)((long)(h + 0x3f) & 0xffffffffffffffc0U) / 0x40);
      ctu_addr = ctu_addr + 1) {
    for (cu16_num_line = 0; cu16_num_line < iVar1; cu16_num_line = cu16_num_line + 1) {
      for (cu16_x = 0; cu16_x < 0x10; cu16_x = cu16_x + 1) {
        *(undefined2 *)
         ((long)dst_buf + (long)((ctu_addr * iVar1 + cu16_num_line) * 0x10 + cu16_x) * 2) =
             *(undefined2 *)
              ((long)src_buf +
              (long)(cu16_num_line * 4 + cu16_x % 4 + (ctu_addr * 4 + cu16_x / 4) * iVar1 * 4) * 2);
      }
    }
  }
  return MPP_OK;
}

Assistant:

static MPP_RET vepu54x_h265_set_roi(void *dst_buf, void *src_buf, RK_S32 w, RK_S32 h)
{
    Vepu541RoiCfg *src = (Vepu541RoiCfg *)src_buf;
    Vepu541RoiCfg *dst = (Vepu541RoiCfg *)dst_buf;
    RK_S32 mb_w = MPP_ALIGN(w, 64) / 64;
    RK_S32 mb_h = MPP_ALIGN(h, 64) / 64;
    RK_S32 ctu_line = mb_w;
    RK_S32 j;

    for (j = 0; j < mb_h; j++) {
        RK_S32 i;

        for (i = 0; i < mb_w; i++) {
            RK_S32 ctu_addr = j * ctu_line + i;
            RK_S32 cu16_num_line = ctu_line * 4;
            RK_S32 cu16cnt;

            for (cu16cnt = 0; cu16cnt < 16; cu16cnt++) {
                RK_S32 cu16_addr_in_frame;
                RK_S32 cu16_x = cu16cnt % 4;
                RK_S32 cu16_y = cu16cnt / 4;

                cu16_x += i * 4;
                cu16_y += j * 4;
                cu16_addr_in_frame = cu16_x + cu16_y * cu16_num_line;

                dst[ctu_addr * 16 + cu16cnt] = src[cu16_addr_in_frame];
            }
        }
    }

    return MPP_OK;
}